

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cpp
# Opt level: O0

CSHA512 * __thiscall CSHA512::Write(CSHA512 *this,uchar *data,size_t len)

{
  long lVar1;
  uchar *puVar2;
  long in_RDX;
  uchar *in_RSI;
  CSHA512 *in_RDI;
  long in_FS_OFFSET;
  size_t bufsize;
  uchar *end;
  ulong local_30;
  uchar *local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = in_RSI + in_RDX;
  local_30 = in_RDI->bytes & 0x7f;
  local_18 = in_RSI;
  if ((local_30 != 0) && (0x7f < local_30 + in_RDX)) {
    memcpy(in_RDI->buf + local_30,in_RSI,0x80 - local_30);
    in_RDI->bytes = (0x80 - local_30) + in_RDI->bytes;
    local_18 = in_RSI + (0x80 - local_30);
    anon_unknown.dwarf_4cfe80::sha512::Transform(in_RDI->s,in_RDI->buf);
    local_30 = 0;
  }
  while (0x7f < (long)puVar2 - (long)local_18) {
    anon_unknown.dwarf_4cfe80::sha512::Transform(in_RDI->s,local_18);
    local_18 = local_18 + 0x80;
    in_RDI->bytes = in_RDI->bytes + 0x80;
  }
  if (local_18 < puVar2) {
    memcpy(in_RDI->buf + local_30,local_18,(long)puVar2 - (long)local_18);
    in_RDI->bytes = (uint64_t)(puVar2 + (in_RDI->bytes - (long)local_18));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

CSHA512& CSHA512::Write(const unsigned char* data, size_t len)
{
    const unsigned char* end = data + len;
    size_t bufsize = bytes % 128;
    if (bufsize && bufsize + len >= 128) {
        // Fill the buffer, and process it.
        memcpy(buf + bufsize, data, 128 - bufsize);
        bytes += 128 - bufsize;
        data += 128 - bufsize;
        sha512::Transform(s, buf);
        bufsize = 0;
    }
    while (end - data >= 128) {
        // Process full chunks directly from the source.
        sha512::Transform(s, data);
        data += 128;
        bytes += 128;
    }
    if (end > data) {
        // Fill the buffer with what remains.
        memcpy(buf + bufsize, data, end - data);
        bytes += end - data;
    }
    return *this;
}